

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_mul(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak32)

{
  long in_RDX;
  void *in_RSI;
  int overflow;
  int ret;
  secp256k1_scalar factor;
  secp256k1_ge p;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  bool bVar1;
  int iVar2;
  uchar *in_stack_ffffffffffffff68;
  secp256k1_scalar *in_stack_ffffffffffffff70;
  secp256k1_ge *in_stack_ffffffffffffff98;
  secp256k1_ge *in_stack_ffffffffffffffa0;
  secp256k1_context *in_stack_ffffffffffffffa8;
  secp256k1_scalar *in_stack_ffffffffffffffd0;
  secp256k1_ge *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  iVar2 = 0;
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x0,
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x0,
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    local_4 = 0;
  }
  else {
    secp256k1_scalar_set_b32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(int *)0x0);
    bVar1 = false;
    if (iVar2 == 0) {
      iVar2 = secp256k1_pubkey_load
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         (secp256k1_pubkey *)in_stack_ffffffffffffff98);
      bVar1 = iVar2 != 0;
    }
    local_4 = (uint)bVar1;
    memset(in_RSI,0,0x40);
    if (local_4 != 0) {
      iVar2 = secp256k1_eckey_pubkey_tweak_mul(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_pubkey_save
                  ((secp256k1_pubkey *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ec_pubkey_tweak_mul(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak32) {
    secp256k1_ge p;
    secp256k1_scalar factor;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = !overflow && secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        if (secp256k1_eckey_pubkey_tweak_mul(&p, &factor)) {
            secp256k1_pubkey_save(pubkey, &p);
        } else {
            ret = 0;
        }
    }

    return ret;
}